

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

void __thiscall wasm::SubTypes::getSubTypesFirstSort()::HeapType_(void *this,HeapType type)

{
  bool bVar1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_00;
  reference pHVar2;
  HeapType pred;
  const_iterator __end3;
  const_iterator __begin3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range3;
  SubTypesFirstSort *this_local;
  HeapType type_local;
  
  this_00 = getStrictSubTypes(*(SubTypes **)((long)this + 0x50),type);
  __end3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_00);
  pred.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                *)&pred);
    if (!bVar1) break;
    pHVar2 = __gnu_cxx::
             __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end3);
    TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::push
              ((TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *)this,(HeapType)pHVar2->id);
    __gnu_cxx::
    __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void pushPredecessors(HeapType type) {
        // Things we need to process before each type are its subtypes. Once we
        // know their depth, we can easily compute our own.
        for (auto pred : parent.getStrictSubTypes(type)) {
          push(pred);
        }
      }